

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O0

void Llb_MnnStop(Llb_Mnn_t *p)

{
  int iVar1;
  long lVar2;
  DdNode *n;
  double local_d0;
  double local_c0;
  double local_b0;
  double local_a0;
  double local_90;
  double local_80;
  double local_70;
  double local_60;
  double local_50;
  double local_40;
  double local_30;
  int local_1c;
  int i;
  DdNode *bTemp;
  Llb_Mnn_t *p_local;
  
  if (p->pPars->fVerbose != 0) {
    p->timeOther = (((p->timeTotal - p->timeImage) - p->timeTran1) - p->timeTran2) - p->timeGloba;
    lVar2 = Cudd_ReadReorderingTime(p->ddG);
    p->timeReoG = lVar2;
    Abc_Print(1,"%s =","Image    ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_30 = ((double)p->timeImage * 100.0) / (double)p->timeTotal;
    }
    else {
      local_30 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeImage * 1.0) / 1000000.0,local_30);
    Abc_Print(1,"%s =","  build  ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_40 = ((double)timeBuild * 100.0) / (double)p->timeTotal;
    }
    else {
      local_40 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)timeBuild * 1.0) / 1000000.0,local_40);
    Abc_Print(1,"%s =","  and-ex ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_50 = ((double)timeAndEx * 100.0) / (double)p->timeTotal;
    }
    else {
      local_50 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)timeAndEx * 1.0) / 1000000.0,local_50);
    Abc_Print(1,"%s =","  other  ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_60 = ((double)timeOther * 100.0) / (double)p->timeTotal;
    }
    else {
      local_60 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)timeOther * 1.0) / 1000000.0,local_60);
    Abc_Print(1,"%s =","Transfer1");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_70 = ((double)p->timeTran1 * 100.0) / (double)p->timeTotal;
    }
    else {
      local_70 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeTran1 * 1.0) / 1000000.0,local_70);
    Abc_Print(1,"%s =","Transfer2");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_80 = ((double)p->timeTran2 * 100.0) / (double)p->timeTotal;
    }
    else {
      local_80 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeTran2 * 1.0) / 1000000.0,local_80);
    Abc_Print(1,"%s =","Global   ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_90 = ((double)p->timeGloba * 100.0) / (double)p->timeTotal;
    }
    else {
      local_90 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeGloba * 1.0) / 1000000.0,local_90);
    Abc_Print(1,"%s =","Other    ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_a0 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    else {
      local_a0 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeOther * 1.0) / 1000000.0,local_a0);
    Abc_Print(1,"%s =","TOTAL    ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_b0 = ((double)p->timeTotal * 100.0) / (double)p->timeTotal;
    }
    else {
      local_b0 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeTotal * 1.0) / 1000000.0,local_b0);
    Abc_Print(1,"%s =","  reo    ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_c0 = ((double)p->timeReo * 100.0) / (double)p->timeTotal;
    }
    else {
      local_c0 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeReo * 1.0) / 1000000.0,local_c0);
    Abc_Print(1,"%s =","  reoG   ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_d0 = ((double)p->timeReoG * 100.0) / (double)p->timeTotal;
    }
    else {
      local_d0 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeReoG * 1.0) / 1000000.0,local_d0);
  }
  if (p->ddR->bFunc != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->ddR,p->ddR->bFunc);
  }
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vRings), local_1c < iVar1; local_1c = local_1c + 1) {
    n = (DdNode *)Vec_PtrEntry(p->vRings,local_1c);
    Cudd_RecursiveDeref(p->ddR,n);
  }
  Vec_PtrFree(p->vRings);
  if (p->ddG->bFunc != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->ddG,p->ddG->bFunc);
  }
  if (p->ddG->bFunc2 != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->ddG,p->ddG->bFunc2);
  }
  Extra_StopManager(p->ddG);
  Extra_StopManager(p->ddR);
  Vec_IntFreeP(&p->vCs2Glo);
  Vec_IntFreeP(&p->vNs2Glo);
  Vec_IntFreeP(&p->vGlo2Cs);
  Vec_IntFreeP(&p->vGlo2Ns);
  Vec_PtrFree(p->vLeaves);
  Vec_PtrFree(p->vRoots);
  if (p->pVars2Q != (int *)0x0) {
    free(p->pVars2Q);
    p->pVars2Q = (int *)0x0;
  }
  if (p->pOrderL != (int *)0x0) {
    free(p->pOrderL);
    p->pOrderL = (int *)0x0;
  }
  if (p->pOrderL2 != (int *)0x0) {
    free(p->pOrderL2);
    p->pOrderL2 = (int *)0x0;
  }
  if (p->pOrderG != (int *)0x0) {
    free(p->pOrderG);
    p->pOrderG = (int *)0x0;
  }
  if (p != (Llb_Mnn_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Llb_MnnStop( Llb_Mnn_t * p )
{
    DdNode * bTemp;
    int i;
    if ( p->pPars->fVerbose ) 
    {
        p->timeOther = p->timeTotal - p->timeImage - p->timeTran1 - p->timeTran2 - p->timeGloba;
        p->timeReoG  = Cudd_ReadReorderingTime(p->ddG);
        ABC_PRTP( "Image    ", p->timeImage, p->timeTotal );
        ABC_PRTP( "  build  ",    timeBuild, p->timeTotal );
        ABC_PRTP( "  and-ex ",    timeAndEx, p->timeTotal );
        ABC_PRTP( "  other  ",    timeOther, p->timeTotal );
        ABC_PRTP( "Transfer1", p->timeTran1, p->timeTotal );
        ABC_PRTP( "Transfer2", p->timeTran2, p->timeTotal );
        ABC_PRTP( "Global   ", p->timeGloba, p->timeTotal );
        ABC_PRTP( "Other    ", p->timeOther, p->timeTotal );
        ABC_PRTP( "TOTAL    ", p->timeTotal, p->timeTotal );
        ABC_PRTP( "  reo    ", p->timeReo,   p->timeTotal );
        ABC_PRTP( "  reoG   ", p->timeReoG,  p->timeTotal );
    }
    if ( p->ddR->bFunc )
        Cudd_RecursiveDeref( p->ddR, p->ddR->bFunc );
    Vec_PtrForEachEntry( DdNode *, p->vRings, bTemp, i )
        Cudd_RecursiveDeref( p->ddR, bTemp );
    Vec_PtrFree( p->vRings );
    if ( p->ddG->bFunc )
        Cudd_RecursiveDeref( p->ddG, p->ddG->bFunc );
    if ( p->ddG->bFunc2 )
        Cudd_RecursiveDeref( p->ddG, p->ddG->bFunc2 );
//    printf( "manager1\n" );
//    Extra_StopManager( p->dd );
//    printf( "manager2\n" );
    Extra_StopManager( p->ddG );
//    printf( "manager3\n" );
    Extra_StopManager( p->ddR );
    Vec_IntFreeP( &p->vCs2Glo );
    Vec_IntFreeP( &p->vNs2Glo );
    Vec_IntFreeP( &p->vGlo2Cs );
    Vec_IntFreeP( &p->vGlo2Ns );
    Vec_PtrFree( p->vLeaves );
    Vec_PtrFree( p->vRoots );
    ABC_FREE( p->pVars2Q );
    ABC_FREE( p->pOrderL );
    ABC_FREE( p->pOrderL2 );
    ABC_FREE( p->pOrderG );
    ABC_FREE( p );
}